

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::
AddTestPattern(ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest> *this,
              char *test_suite_name,char *test_base_name,
              TestMetaFactoryBase<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
              *meta_factory,CodeLocation *code_location)

{
  CodeLocation *this_00;
  long in_RDI;
  TestInfo *in_stack_ffffffffffffff58;
  CodeLocation *in_stack_ffffffffffffffb0;
  TestMetaFactoryBase<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
  *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  TestInfo *in_stack_ffffffffffffffd0;
  
  this_00 = (CodeLocation *)(in_RDI + 0x50);
  operator_new(0x70);
  CodeLocation::CodeLocation(this_00,(CodeLocation *)in_stack_ffffffffffffff58);
  TestInfo::TestInfo(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>
  ::
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo,void>
            ((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>
              *)this_00,in_stack_ffffffffffffff58);
  std::
  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>_>_>
  ::push_back((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>_>_>
               *)this_00,(value_type *)in_stack_ffffffffffffff58);
  std::
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>
  ::~shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>
                 *)0x9c5902);
  CodeLocation::~CodeLocation((CodeLocation *)0x9c590c);
  return;
}

Assistant:

void AddTestPattern(const char* test_suite_name, const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory,
                      CodeLocation code_location) {
    tests_.push_back(std::shared_ptr<TestInfo>(new TestInfo(
        test_suite_name, test_base_name, meta_factory, code_location)));
  }